

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  int iVar45;
  int *piVar47;
  Scene *pSVar48;
  ulong uVar49;
  long lVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [16];
  undefined1 (*pauVar58) [16];
  undefined4 uVar59;
  ulong unaff_R12;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar69 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  float fVar99;
  undefined1 auVar98 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  uint uVar104;
  uint uVar106;
  uint uVar107;
  uint uVar108;
  undefined1 auVar105 [64];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar111 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2660;
  undefined8 uStack_2658;
  int local_2634;
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  RTCIntersectArguments *local_25d8;
  RTCFilterFunctionNArguments local_25d0;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  float local_2580;
  undefined4 local_257c;
  undefined4 local_2578;
  float local_2574;
  float local_2570;
  undefined4 local_256c;
  uint local_2568;
  uint local_2564;
  uint local_2560;
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_24f0 [16];
  float local_24e0 [4];
  float local_24d0 [4];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  int iVar46;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar73 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar84 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar93._8_4_ = 0x7fffffff;
      auVar93._0_8_ = 0x7fffffff7fffffff;
      auVar93._12_4_ = 0x7fffffff;
      auVar93 = vandps_avx((undefined1  [16])aVar2,auVar93);
      auVar95._8_4_ = 0x219392ef;
      auVar95._0_8_ = 0x219392ef219392ef;
      auVar95._12_4_ = 0x219392ef;
      auVar93 = vcmpps_avx(auVar93,auVar95,1);
      auVar93 = vblendvps_avx((undefined1  [16])aVar2,auVar95,auVar93);
      pauVar58 = (undefined1 (*) [16])local_2390;
      auVar95 = vrcpps_avx(auVar93);
      fVar63 = auVar95._0_4_;
      auVar90._0_4_ = auVar93._0_4_ * fVar63;
      fVar70 = auVar95._4_4_;
      auVar90._4_4_ = auVar93._4_4_ * fVar70;
      fVar71 = auVar95._8_4_;
      auVar90._8_4_ = auVar93._8_4_ * fVar71;
      fVar72 = auVar95._12_4_;
      auVar90._12_4_ = auVar93._12_4_ * fVar72;
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = &DAT_3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar93 = vsubps_avx(auVar96,auVar90);
      uVar59 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar59;
      local_23c0._0_4_ = uVar59;
      local_23c0._8_4_ = uVar59;
      local_23c0._12_4_ = uVar59;
      local_23c0._16_4_ = uVar59;
      local_23c0._20_4_ = uVar59;
      local_23c0._24_4_ = uVar59;
      local_23c0._28_4_ = uVar59;
      auVar98 = ZEXT3264(local_23c0);
      uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar59;
      local_23e0._0_4_ = uVar59;
      local_23e0._8_4_ = uVar59;
      local_23e0._12_4_ = uVar59;
      local_23e0._16_4_ = uVar59;
      local_23e0._20_4_ = uVar59;
      local_23e0._24_4_ = uVar59;
      local_23e0._28_4_ = uVar59;
      auVar101 = ZEXT3264(local_23e0);
      uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar59;
      local_2400._0_4_ = uVar59;
      local_2400._8_4_ = uVar59;
      local_2400._12_4_ = uVar59;
      local_2400._16_4_ = uVar59;
      local_2400._20_4_ = uVar59;
      local_2400._24_4_ = uVar59;
      local_2400._28_4_ = uVar59;
      auVar103 = ZEXT3264(local_2400);
      auVar91._0_4_ = fVar63 + fVar63 * auVar93._0_4_;
      auVar91._4_4_ = fVar70 + fVar70 * auVar93._4_4_;
      auVar91._8_4_ = fVar71 + fVar71 * auVar93._8_4_;
      auVar91._12_4_ = fVar72 + fVar72 * auVar93._12_4_;
      auVar93 = vshufps_avx(auVar91,auVar91,0);
      local_2420._16_16_ = auVar93;
      local_2420._0_16_ = auVar93;
      auVar105 = ZEXT3264(local_2420);
      auVar93 = vmovshdup_avx(auVar91);
      auVar95 = vshufps_avx(auVar91,auVar91,0x55);
      local_2440._16_16_ = auVar95;
      local_2440._0_16_ = auVar95;
      auVar109 = ZEXT3264(local_2440);
      auVar95 = vshufpd_avx(auVar91,auVar91,1);
      auVar90 = vshufps_avx(auVar91,auVar91,0xaa);
      uVar52 = (ulong)(auVar91._0_4_ < 0.0) << 5;
      local_2460._16_16_ = auVar90;
      local_2460._0_16_ = auVar90;
      auVar111 = ZEXT3264(local_2460);
      uVar55 = (ulong)(auVar93._0_4_ < 0.0) << 5 | 0x40;
      uVar56 = (ulong)(auVar95._0_4_ < 0.0) << 5 | 0x80;
      uVar49 = uVar52 ^ 0x20;
      auVar93 = vshufps_avx(auVar73,auVar73,0);
      local_2480._16_16_ = auVar93;
      local_2480._0_16_ = auVar93;
      auVar119 = ZEXT3264(local_2480);
      auVar93 = vshufps_avx(auVar84,auVar84,0);
      auVar69 = ZEXT3264(CONCAT1616(auVar93,auVar93));
      local_2550 = mm_lookupmask_ps._240_8_;
      uStack_2548 = mm_lookupmask_ps._248_8_;
      do {
        do {
          do {
            if (pauVar58 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar57 = pauVar58 + -1;
            pauVar58 = pauVar58 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar57 + 8));
          uVar61 = *(ulong *)*pauVar58;
          do {
            auVar102 = auVar103._0_32_;
            auVar100 = auVar101._0_32_;
            auVar97 = auVar98._0_32_;
            if ((uVar61 & 8) == 0) {
              auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar52),auVar97);
              auVar17._4_4_ = auVar105._4_4_ * auVar16._4_4_;
              auVar17._0_4_ = auVar105._0_4_ * auVar16._0_4_;
              auVar17._8_4_ = auVar105._8_4_ * auVar16._8_4_;
              auVar17._12_4_ = auVar105._12_4_ * auVar16._12_4_;
              auVar17._16_4_ = auVar105._16_4_ * auVar16._16_4_;
              auVar17._20_4_ = auVar105._20_4_ * auVar16._20_4_;
              auVar17._24_4_ = auVar105._24_4_ * auVar16._24_4_;
              auVar17._28_4_ = auVar16._28_4_;
              auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar55),auVar100);
              auVar19._4_4_ = auVar109._4_4_ * auVar16._4_4_;
              auVar19._0_4_ = auVar109._0_4_ * auVar16._0_4_;
              auVar19._8_4_ = auVar109._8_4_ * auVar16._8_4_;
              auVar19._12_4_ = auVar109._12_4_ * auVar16._12_4_;
              auVar19._16_4_ = auVar109._16_4_ * auVar16._16_4_;
              auVar19._20_4_ = auVar109._20_4_ * auVar16._20_4_;
              auVar19._24_4_ = auVar109._24_4_ * auVar16._24_4_;
              auVar19._28_4_ = auVar16._28_4_;
              auVar16 = vmaxps_avx(auVar17,auVar19);
              auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar56),auVar102);
              auVar20._4_4_ = auVar111._4_4_ * auVar17._4_4_;
              auVar20._0_4_ = auVar111._0_4_ * auVar17._0_4_;
              auVar20._8_4_ = auVar111._8_4_ * auVar17._8_4_;
              auVar20._12_4_ = auVar111._12_4_ * auVar17._12_4_;
              auVar20._16_4_ = auVar111._16_4_ * auVar17._16_4_;
              auVar20._20_4_ = auVar111._20_4_ * auVar17._20_4_;
              auVar20._24_4_ = auVar111._24_4_ * auVar17._24_4_;
              auVar20._28_4_ = auVar17._28_4_;
              auVar17 = vmaxps_avx(auVar20,auVar119._0_32_);
              local_2540 = vmaxps_avx(auVar16,auVar17);
              auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar49),auVar97);
              auVar21._4_4_ = auVar105._4_4_ * auVar16._4_4_;
              auVar21._0_4_ = auVar105._0_4_ * auVar16._0_4_;
              auVar21._8_4_ = auVar105._8_4_ * auVar16._8_4_;
              auVar21._12_4_ = auVar105._12_4_ * auVar16._12_4_;
              auVar21._16_4_ = auVar105._16_4_ * auVar16._16_4_;
              auVar21._20_4_ = auVar105._20_4_ * auVar16._20_4_;
              auVar21._24_4_ = auVar105._24_4_ * auVar16._24_4_;
              auVar21._28_4_ = auVar16._28_4_;
              auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + (uVar55 ^ 0x20)),auVar100)
              ;
              auVar22._4_4_ = auVar109._4_4_ * auVar16._4_4_;
              auVar22._0_4_ = auVar109._0_4_ * auVar16._0_4_;
              auVar22._8_4_ = auVar109._8_4_ * auVar16._8_4_;
              auVar22._12_4_ = auVar109._12_4_ * auVar16._12_4_;
              auVar22._16_4_ = auVar109._16_4_ * auVar16._16_4_;
              auVar22._20_4_ = auVar109._20_4_ * auVar16._20_4_;
              auVar22._24_4_ = auVar109._24_4_ * auVar16._24_4_;
              auVar22._28_4_ = auVar16._28_4_;
              auVar16 = vminps_avx(auVar21,auVar22);
              auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + (uVar56 ^ 0x20)),auVar102)
              ;
              auVar23._4_4_ = auVar111._4_4_ * auVar17._4_4_;
              auVar23._0_4_ = auVar111._0_4_ * auVar17._0_4_;
              auVar23._8_4_ = auVar111._8_4_ * auVar17._8_4_;
              auVar23._12_4_ = auVar111._12_4_ * auVar17._12_4_;
              auVar23._16_4_ = auVar111._16_4_ * auVar17._16_4_;
              auVar23._20_4_ = auVar111._20_4_ * auVar17._20_4_;
              auVar23._24_4_ = auVar111._24_4_ * auVar17._24_4_;
              auVar23._28_4_ = auVar17._28_4_;
              auVar17 = vminps_avx(auVar23,auVar69._0_32_);
              auVar16 = vminps_avx(auVar16,auVar17);
              auVar16 = vcmpps_avx(local_2540,auVar16,2);
              uVar59 = vmovmskps_avx(auVar16);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar59);
            }
            if ((uVar61 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar45 = 4;
              }
              else {
                uVar60 = uVar61 & 0xfffffffffffffff0;
                lVar50 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                  }
                }
                iVar45 = 0;
                iVar46 = 0;
                uVar61 = *(ulong *)(uVar60 + lVar50 * 8);
                uVar54 = unaff_R12 - 1 & unaff_R12;
                if (uVar54 != 0) {
                  uVar104 = *(uint *)(local_2540 + lVar50 * 4);
                  lVar50 = 0;
                  if (uVar54 != 0) {
                    for (; (uVar54 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                    }
                  }
                  uVar3 = *(ulong *)(uVar60 + lVar50 * 8);
                  uVar106 = *(uint *)(local_2540 + lVar50 * 4);
                  uVar54 = uVar54 - 1 & uVar54;
                  iVar45 = iVar46;
                  if (uVar54 == 0) {
                    if (uVar104 < uVar106) {
                      *(ulong *)*pauVar58 = uVar3;
                      *(uint *)(*pauVar58 + 8) = uVar106;
                      pauVar58 = pauVar58 + 1;
                    }
                    else {
                      *(ulong *)*pauVar58 = uVar61;
                      *(uint *)(*pauVar58 + 8) = uVar104;
                      pauVar58 = pauVar58 + 1;
                      uVar61 = uVar3;
                    }
                  }
                  else {
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar61;
                    auVar93 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar104));
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar3;
                    auVar73 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar106));
                    lVar50 = 0;
                    if (uVar54 != 0) {
                      for (; (uVar54 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                      }
                    }
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
                    auVar84 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_2540 + lVar50 * 4)));
                    uVar54 = uVar54 - 1 & uVar54;
                    if (uVar54 == 0) {
                      auVar95 = vpcmpgtd_avx(auVar73,auVar93);
                      auVar90 = vpshufd_avx(auVar95,0xaa);
                      auVar95 = vblendvps_avx(auVar73,auVar93,auVar90);
                      auVar93 = vblendvps_avx(auVar93,auVar73,auVar90);
                      auVar73 = vpcmpgtd_avx(auVar84,auVar95);
                      auVar90 = vpshufd_avx(auVar73,0xaa);
                      auVar73 = vblendvps_avx(auVar84,auVar95,auVar90);
                      auVar84 = vblendvps_avx(auVar95,auVar84,auVar90);
                      auVar95 = vpcmpgtd_avx(auVar84,auVar93);
                      auVar90 = vpshufd_avx(auVar95,0xaa);
                      auVar95 = vblendvps_avx(auVar84,auVar93,auVar90);
                      auVar93 = vblendvps_avx(auVar93,auVar84,auVar90);
                      *pauVar58 = auVar93;
                      pauVar58[1] = auVar95;
                      pauVar58 = pauVar58 + 2;
                      uVar61 = auVar73._0_8_;
                    }
                    else {
                      lVar50 = 0;
                      if (uVar54 != 0) {
                        for (; (uVar54 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                        }
                      }
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
                      auVar95 = vpunpcklqdq_avx(auVar94,ZEXT416(*(uint *)(local_2540 + lVar50 * 4)))
                      ;
                      uVar54 = uVar54 - 1 & uVar54;
                      if (uVar54 == 0) {
                        auVar90 = vpcmpgtd_avx(auVar73,auVar93);
                        auVar91 = vpshufd_avx(auVar90,0xaa);
                        auVar90 = vblendvps_avx(auVar73,auVar93,auVar91);
                        auVar93 = vblendvps_avx(auVar93,auVar73,auVar91);
                        auVar73 = vpcmpgtd_avx(auVar95,auVar84);
                        auVar91 = vpshufd_avx(auVar73,0xaa);
                        auVar73 = vblendvps_avx(auVar95,auVar84,auVar91);
                        auVar84 = vblendvps_avx(auVar84,auVar95,auVar91);
                        auVar95 = vpcmpgtd_avx(auVar84,auVar93);
                        auVar91 = vpshufd_avx(auVar95,0xaa);
                        auVar95 = vblendvps_avx(auVar84,auVar93,auVar91);
                        auVar93 = vblendvps_avx(auVar93,auVar84,auVar91);
                        auVar84 = vpcmpgtd_avx(auVar73,auVar90);
                        auVar91 = vpshufd_avx(auVar84,0xaa);
                        auVar84 = vblendvps_avx(auVar73,auVar90,auVar91);
                        auVar73 = vblendvps_avx(auVar90,auVar73,auVar91);
                        auVar90 = vpcmpgtd_avx(auVar95,auVar73);
                        auVar91 = vpshufd_avx(auVar90,0xaa);
                        auVar90 = vblendvps_avx(auVar95,auVar73,auVar91);
                        auVar73 = vblendvps_avx(auVar73,auVar95,auVar91);
                        *pauVar58 = auVar93;
                        pauVar58[1] = auVar73;
                        pauVar58[2] = auVar90;
                        uVar61 = auVar84._0_8_;
                        pauVar57 = pauVar58 + 3;
                      }
                      else {
                        *pauVar58 = auVar93;
                        pauVar58[1] = auVar73;
                        pauVar58[2] = auVar84;
                        pauVar58[3] = auVar95;
                        lVar50 = 0x30;
                        do {
                          lVar62 = lVar50;
                          lVar50 = 0;
                          if (uVar54 != 0) {
                            for (; (uVar54 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                            }
                          }
                          auVar74._8_8_ = 0;
                          auVar74._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
                          auVar93 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_2540 +
                                                                             lVar50 * 4)));
                          *(undefined1 (*) [16])(pauVar58[1] + lVar62) = auVar93;
                          uVar54 = uVar54 & uVar54 - 1;
                          lVar50 = lVar62 + 0x10;
                        } while (uVar54 != 0);
                        pauVar57 = (undefined1 (*) [16])(pauVar58[1] + lVar62);
                        if (lVar62 + 0x10 != 0) {
                          lVar50 = 0x10;
                          pauVar51 = pauVar58;
                          do {
                            auVar93 = pauVar51[1];
                            uVar104 = *(uint *)(pauVar51[1] + 8);
                            pauVar51 = pauVar51 + 1;
                            lVar62 = lVar50;
                            do {
                              if (uVar104 <= *(uint *)(pauVar58[-1] + lVar62 + 8)) {
                                pauVar53 = (undefined1 (*) [16])(*pauVar58 + lVar62);
                                break;
                              }
                              *(undefined1 (*) [16])(*pauVar58 + lVar62) =
                                   *(undefined1 (*) [16])(pauVar58[-1] + lVar62);
                              lVar62 = lVar62 + -0x10;
                              pauVar53 = pauVar58;
                            } while (lVar62 != 0);
                            *pauVar53 = auVar93;
                            lVar50 = lVar50 + 0x10;
                          } while (pauVar57 != pauVar51);
                        }
                        uVar61 = *(ulong *)*pauVar57;
                      }
                      auVar98 = ZEXT3264(auVar97);
                      auVar101 = ZEXT3264(auVar100);
                      auVar103 = ZEXT3264(auVar102);
                      auVar105 = ZEXT3264(auVar105._0_32_);
                      auVar109 = ZEXT3264(auVar109._0_32_);
                      auVar111 = ZEXT3264(auVar111._0_32_);
                      auVar119 = ZEXT3264(auVar119._0_32_);
                      pauVar58 = pauVar57;
                    }
                  }
                }
              }
            }
            else {
              iVar45 = 6;
            }
          } while (iVar45 == 0);
        } while (iVar45 != 6);
        uVar60 = (ulong)((uint)uVar61 & 0xf);
        if (uVar60 != 8) {
          uVar61 = uVar61 & 0xfffffffffffffff0;
          lVar50 = 0;
          do {
            lVar62 = lVar50 * 0xb0;
            pfVar1 = (float *)(uVar61 + 0x80 + lVar62);
            fVar24 = *pfVar1;
            fVar25 = pfVar1[1];
            fVar26 = pfVar1[2];
            fVar27 = pfVar1[3];
            pfVar1 = (float *)(uVar61 + 0x40 + lVar62);
            fVar28 = *pfVar1;
            fVar29 = pfVar1[1];
            fVar30 = pfVar1[2];
            fVar31 = pfVar1[3];
            auVar64._0_4_ = fVar24 * fVar28;
            auVar64._4_4_ = fVar25 * fVar29;
            auVar64._8_4_ = fVar26 * fVar30;
            auVar64._12_4_ = fVar27 * fVar31;
            pfVar1 = (float *)(uVar61 + 0x70 + lVar62);
            fVar32 = *pfVar1;
            fVar33 = pfVar1[1];
            fVar34 = pfVar1[2];
            fVar35 = pfVar1[3];
            pfVar1 = (float *)(uVar61 + 0x50 + lVar62);
            fVar36 = *pfVar1;
            fVar37 = pfVar1[1];
            fVar38 = pfVar1[2];
            fVar39 = pfVar1[3];
            auVar75._0_4_ = fVar32 * fVar36;
            auVar75._4_4_ = fVar33 * fVar37;
            auVar75._8_4_ = fVar34 * fVar38;
            auVar75._12_4_ = fVar35 * fVar39;
            local_2600 = vsubps_avx(auVar75,auVar64);
            auVar93 = *(undefined1 (*) [16])(uVar61 + 0x60 + lVar62);
            fVar110 = auVar93._0_4_;
            auVar76._0_4_ = fVar110 * fVar36;
            fVar112 = auVar93._4_4_;
            auVar76._4_4_ = fVar112 * fVar37;
            fVar113 = auVar93._8_4_;
            auVar76._8_4_ = fVar113 * fVar38;
            fVar114 = auVar93._12_4_;
            auVar76._12_4_ = fVar114 * fVar39;
            pfVar1 = (float *)(uVar61 + 0x30 + lVar62);
            fVar40 = *pfVar1;
            fVar41 = pfVar1[1];
            fVar42 = pfVar1[2];
            fVar43 = pfVar1[3];
            auVar85._0_4_ = fVar24 * fVar40;
            auVar85._4_4_ = fVar25 * fVar41;
            auVar85._8_4_ = fVar26 * fVar42;
            auVar85._12_4_ = fVar27 * fVar43;
            auVar84 = vsubps_avx(auVar85,auVar76);
            auVar86._0_4_ = fVar32 * fVar40;
            auVar86._4_4_ = fVar33 * fVar41;
            auVar86._8_4_ = fVar34 * fVar42;
            auVar86._12_4_ = fVar35 * fVar43;
            auVar115._0_4_ = fVar110 * fVar28;
            auVar115._4_4_ = fVar112 * fVar29;
            auVar115._8_4_ = fVar113 * fVar30;
            auVar115._12_4_ = fVar114 * fVar31;
            local_2630 = vsubps_avx(auVar115,auVar86);
            uVar59 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar116._4_4_ = uVar59;
            auVar116._0_4_ = uVar59;
            auVar116._8_4_ = uVar59;
            auVar116._12_4_ = uVar59;
            local_2590 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + lVar62),auVar116);
            uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar117._4_4_ = uVar59;
            auVar117._0_4_ = uVar59;
            auVar117._8_4_ = uVar59;
            auVar117._12_4_ = uVar59;
            local_2610 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x10 + lVar62),auVar117);
            uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar118._4_4_ = uVar59;
            auVar118._0_4_ = uVar59;
            auVar118._8_4_ = uVar59;
            auVar118._12_4_ = uVar59;
            local_2620 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + lVar62),auVar118);
            fVar63 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar70 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar72 = local_2620._0_4_;
            auVar120._0_4_ = fVar63 * fVar72;
            fVar7 = local_2620._4_4_;
            auVar120._4_4_ = fVar63 * fVar7;
            fVar10 = local_2620._8_4_;
            auVar120._8_4_ = fVar63 * fVar10;
            fVar13 = local_2620._12_4_;
            auVar120._12_4_ = fVar63 * fVar13;
            fVar99 = local_2610._0_4_;
            auVar121._0_4_ = fVar70 * fVar99;
            fVar8 = local_2610._4_4_;
            auVar121._4_4_ = fVar70 * fVar8;
            fVar11 = local_2610._8_4_;
            auVar121._8_4_ = fVar70 * fVar11;
            fVar14 = local_2610._12_4_;
            auVar121._12_4_ = fVar70 * fVar14;
            auVar73 = vsubps_avx(auVar121,auVar120);
            fVar71 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar6 = local_2590._0_4_;
            auVar65._0_4_ = fVar70 * fVar6;
            fVar9 = local_2590._4_4_;
            auVar65._4_4_ = fVar70 * fVar9;
            fVar12 = local_2590._8_4_;
            auVar65._8_4_ = fVar70 * fVar12;
            fVar15 = local_2590._12_4_;
            auVar65._12_4_ = fVar70 * fVar15;
            auVar77._0_4_ = fVar71 * fVar72;
            auVar77._4_4_ = fVar71 * fVar7;
            auVar77._8_4_ = fVar71 * fVar10;
            auVar77._12_4_ = fVar71 * fVar13;
            auVar95 = vsubps_avx(auVar77,auVar65);
            auVar78._0_4_ = fVar71 * fVar99;
            auVar78._4_4_ = fVar71 * fVar8;
            auVar78._8_4_ = fVar71 * fVar11;
            auVar78._12_4_ = fVar71 * fVar14;
            auVar87._0_4_ = fVar63 * fVar6;
            auVar87._4_4_ = fVar63 * fVar9;
            auVar87._8_4_ = fVar63 * fVar12;
            auVar87._12_4_ = fVar63 * fVar15;
            auVar90 = vsubps_avx(auVar87,auVar78);
            auVar91 = local_2630;
            auVar88._0_4_ =
                 local_2600._0_4_ * fVar71 + fVar63 * auVar84._0_4_ + fVar70 * local_2630._0_4_;
            auVar88._4_4_ =
                 local_2600._4_4_ * fVar71 + fVar63 * auVar84._4_4_ + fVar70 * local_2630._4_4_;
            auVar88._8_4_ =
                 local_2600._8_4_ * fVar71 + fVar63 * auVar84._8_4_ + fVar70 * local_2630._8_4_;
            auVar88._12_4_ =
                 local_2600._12_4_ * fVar71 + fVar63 * auVar84._12_4_ + fVar70 * local_2630._12_4_;
            auVar79._8_8_ = 0x8000000080000000;
            auVar79._0_8_ = 0x8000000080000000;
            auVar93 = vandps_avx(auVar88,auVar79);
            uVar104 = auVar93._0_4_;
            local_2540._0_4_ =
                 (float)(uVar104 ^
                        (uint)(fVar110 * auVar73._0_4_ +
                              fVar24 * auVar90._0_4_ + fVar32 * auVar95._0_4_));
            uVar106 = auVar93._4_4_;
            local_2540._4_4_ =
                 (float)(uVar106 ^
                        (uint)(fVar112 * auVar73._4_4_ +
                              fVar25 * auVar90._4_4_ + fVar33 * auVar95._4_4_));
            uVar107 = auVar93._8_4_;
            local_2540._8_4_ =
                 (float)(uVar107 ^
                        (uint)(fVar113 * auVar73._8_4_ +
                              fVar26 * auVar90._8_4_ + fVar34 * auVar95._8_4_));
            uVar108 = auVar93._12_4_;
            local_2540._12_4_ =
                 (float)(uVar108 ^
                        (uint)(fVar114 * auVar73._12_4_ +
                              fVar27 * auVar90._12_4_ + fVar35 * auVar95._12_4_));
            local_2540._16_4_ =
                 (float)(uVar104 ^
                        (uint)(fVar40 * auVar73._0_4_ +
                              fVar36 * auVar90._0_4_ + fVar28 * auVar95._0_4_));
            local_2540._20_4_ =
                 (float)(uVar106 ^
                        (uint)(fVar41 * auVar73._4_4_ +
                              fVar37 * auVar90._4_4_ + fVar29 * auVar95._4_4_));
            local_2540._24_4_ =
                 (float)(uVar107 ^
                        (uint)(fVar42 * auVar73._8_4_ +
                              fVar38 * auVar90._8_4_ + fVar30 * auVar95._8_4_));
            local_2540._28_4_ =
                 (float)(uVar108 ^
                        (uint)(fVar43 * auVar73._12_4_ +
                              fVar39 * auVar90._12_4_ + fVar31 * auVar95._12_4_));
            auVar95 = ZEXT416(0) << 0x20;
            auVar93 = vcmpps_avx(local_2540._0_16_,auVar95,5);
            auVar73 = vcmpps_avx(local_2540._16_16_,auVar95,5);
            auVar93 = vandps_avx(auVar93,auVar73);
            auVar80._8_4_ = 0x7fffffff;
            auVar80._0_8_ = 0x7fffffff7fffffff;
            auVar80._12_4_ = 0x7fffffff;
            local_2510 = vandps_avx(auVar88,auVar80);
            auVar73 = vcmpps_avx(auVar95,auVar88,4);
            auVar93 = vandps_avx(auVar93,auVar73);
            auVar81._0_4_ = local_2540._16_4_ + local_2540._0_4_;
            auVar81._4_4_ = local_2540._20_4_ + local_2540._4_4_;
            auVar81._8_4_ = local_2540._24_4_ + local_2540._8_4_;
            auVar81._12_4_ = local_2540._28_4_ + local_2540._12_4_;
            auVar73 = vcmpps_avx(auVar81,local_2510,2);
            auVar93 = vandps_avx(auVar93,auVar73);
            auVar18._8_8_ = uStack_2548;
            auVar18._0_8_ = local_2550;
            auVar18 = auVar18 & auVar93;
            if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar18[0xf] < '\0') {
              auVar44._8_8_ = uStack_2548;
              auVar44._0_8_ = local_2550;
              auVar93 = vandps_avx(auVar93,auVar44);
              local_2520._0_4_ =
                   (float)(uVar104 ^
                          (uint)(local_2600._0_4_ * fVar6 +
                                fVar99 * auVar84._0_4_ + fVar72 * local_2630._0_4_));
              local_2520._4_4_ =
                   (float)(uVar106 ^
                          (uint)(local_2600._4_4_ * fVar9 +
                                fVar8 * auVar84._4_4_ + fVar7 * local_2630._4_4_));
              local_2520._8_4_ =
                   (float)(uVar107 ^
                          (uint)(local_2600._8_4_ * fVar12 +
                                fVar11 * auVar84._8_4_ + fVar10 * local_2630._8_4_));
              local_2520._12_4_ =
                   (float)(uVar108 ^
                          (uint)(local_2600._12_4_ * fVar15 +
                                fVar14 * auVar84._12_4_ + fVar13 * local_2630._12_4_));
              fVar63 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar70 = local_2510._0_4_;
              auVar66._0_4_ = fVar70 * fVar63;
              fVar71 = local_2510._4_4_;
              auVar66._4_4_ = fVar71 * fVar63;
              fVar72 = local_2510._8_4_;
              auVar66._8_4_ = fVar72 * fVar63;
              fVar99 = local_2510._12_4_;
              auVar66._12_4_ = fVar99 * fVar63;
              auVar73 = vcmpps_avx(auVar66,local_2520,1);
              fVar63 = (ray->super_RayK<1>).tfar;
              auVar82._0_4_ = fVar70 * fVar63;
              auVar82._4_4_ = fVar71 * fVar63;
              auVar82._8_4_ = fVar72 * fVar63;
              auVar82._12_4_ = fVar99 * fVar63;
              auVar95 = vcmpps_avx(local_2520,auVar82,2);
              auVar73 = vandps_avx(auVar95,auVar73);
              auVar95 = auVar93 & auVar73;
              if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar95[0xf] < '\0') {
                auVar93 = vandps_avx(auVar93,auVar73);
                local_24f0 = auVar93;
                local_24b0 = local_2600;
                local_2660 = auVar84._0_8_;
                uStack_2658 = auVar84._8_8_;
                local_24a0 = local_2660;
                uStack_2498 = uStack_2658;
                local_2490 = local_2630._0_8_;
                uStack_2488 = local_2630._8_8_;
                auVar73 = vrcpps_avx(local_2510);
                fVar63 = auVar73._0_4_;
                auVar83._0_4_ = fVar70 * fVar63;
                fVar70 = auVar73._4_4_;
                auVar83._4_4_ = fVar71 * fVar70;
                fVar71 = auVar73._8_4_;
                auVar83._8_4_ = fVar72 * fVar71;
                fVar72 = auVar73._12_4_;
                auVar83._12_4_ = fVar99 * fVar72;
                auVar89._8_4_ = 0x3f800000;
                auVar89._0_8_ = &DAT_3f8000003f800000;
                auVar89._12_4_ = 0x3f800000;
                auVar73 = vsubps_avx(auVar89,auVar83);
                fVar63 = fVar63 + fVar63 * auVar73._0_4_;
                fVar70 = fVar70 + fVar70 * auVar73._4_4_;
                fVar71 = fVar71 + fVar71 * auVar73._8_4_;
                fVar72 = fVar72 + fVar72 * auVar73._12_4_;
                local_24c0._0_4_ = fVar63 * local_2520._0_4_;
                local_24c0._4_4_ = fVar70 * local_2520._4_4_;
                local_24c0._8_4_ = fVar71 * local_2520._8_4_;
                local_24c0._12_4_ = fVar72 * local_2520._12_4_;
                local_25f0 = auVar93;
                local_24e0[0] = fVar63 * local_2540._0_4_;
                local_24e0[1] = fVar70 * local_2540._4_4_;
                local_24e0[2] = fVar71 * local_2540._8_4_;
                local_24e0[3] = fVar72 * local_2540._12_4_;
                local_24d0[0] = fVar63 * local_2540._16_4_;
                local_24d0[1] = fVar70 * local_2540._20_4_;
                local_24d0[2] = fVar71 * local_2540._24_4_;
                local_24d0[3] = fVar72 * local_2540._28_4_;
                auVar67._8_4_ = 0x7f800000;
                auVar67._0_8_ = 0x7f8000007f800000;
                auVar67._12_4_ = 0x7f800000;
                auVar73 = vblendvps_avx(auVar67,local_24c0,auVar93);
                auVar84 = vshufps_avx(auVar73,auVar73,0xb1);
                auVar84 = vminps_avx(auVar84,auVar73);
                auVar95 = vshufpd_avx(auVar84,auVar84,1);
                auVar84 = vminps_avx(auVar95,auVar84);
                auVar73 = vcmpps_avx(auVar73,auVar84,0);
                auVar84 = auVar93 & auVar73;
                if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar84[0xf] < '\0') {
                  auVar93 = vandps_avx(auVar73,auVar93);
                }
                lVar62 = lVar62 + uVar61;
                uVar59 = vmovmskps_avx(auVar93);
                uVar54 = CONCAT44((int)((ulong)context >> 0x20),uVar59);
                piVar47 = (int *)0x0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> (long)piVar47 & 1) == 0; piVar47 = (int *)((long)piVar47 + 1)) {
                  }
                }
                local_2590._0_8_ = context->scene;
                pSVar48 = context->scene;
                auVar93 = local_24c0;
                local_2630 = auVar91;
                do {
                  uVar104 = *(uint *)(lVar62 + 0x90 + (long)piVar47 * 4);
                  pGVar4 = (pSVar48->geometries).items[uVar104].ptr;
                  local_2600._0_8_ = pGVar4;
                  if ((pGVar4->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_25f0 + (long)piVar47 * 4) = 0;
                  }
                  else {
                    local_2630._0_8_ = piVar47;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar63 = local_24e0[(long)piVar47];
                      fVar70 = local_24d0[(long)piVar47];
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_24b0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.y =
                           *(float *)((long)&local_24a0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.z =
                           *(float *)((long)&local_2490 + (long)piVar47 * 4);
                      ray->u = fVar63;
                      ray->v = fVar70;
                      ray->primID = *(uint *)(lVar62 + 0xa0 + (long)piVar47 * 4);
                      ray->geomID = uVar104;
                      pRVar5 = context->user;
                      ray->instID[0] = pRVar5->instID[0];
                      ray->instPrimID[0] = pRVar5->instPrimID[0];
                      break;
                    }
                    local_25d8 = context->args;
                    local_25a0 = auVar93;
                    local_2620._0_8_ = uVar52;
                    local_2610._0_8_ = pauVar58;
                    local_25d0.context = context->user;
                    local_2580 = *(float *)(local_24b0 + (long)piVar47 * 4);
                    local_257c = *(undefined4 *)((long)&local_24a0 + (long)piVar47 * 4);
                    local_2578 = *(undefined4 *)((long)&local_2490 + (long)piVar47 * 4);
                    local_2574 = local_24e0[(long)piVar47];
                    local_2570 = local_24d0[(long)piVar47];
                    local_256c = *(undefined4 *)(lVar62 + 0xa0 + (long)piVar47 * 4);
                    local_2568 = uVar104;
                    local_2564 = (local_25d0.context)->instID[0];
                    local_2560 = (local_25d0.context)->instPrimID[0];
                    fVar63 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar47 * 4);
                    local_2634 = -1;
                    local_25d0.valid = &local_2634;
                    local_25d0.geometryUserPtr = pGVar4->userPtr;
                    local_25d0.ray = (RTCRayN *)ray;
                    local_25d0.hit = (RTCHitN *)&local_2580;
                    local_25d0.N = 1;
                    if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->intersectionFilterN)(&local_25d0), *local_25d0.valid != 0)) {
                      if (local_25d8->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_25d8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_2600._0_8_ + 0x3e) & 0x40) != 0)) {
                          (*local_25d8->filter)(&local_25d0);
                        }
                        if (*local_25d0.valid == 0) goto LAB_015a9ad5;
                      }
                      (((Vec3f *)((long)local_25d0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25d0.hit;
                      (((Vec3f *)((long)local_25d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25d0.hit + 4);
                      (((Vec3f *)((long)local_25d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25d0.hit + 8);
                      *(float *)((long)local_25d0.ray + 0x3c) = *(float *)(local_25d0.hit + 0xc);
                      *(float *)((long)local_25d0.ray + 0x40) = *(float *)(local_25d0.hit + 0x10);
                      *(float *)((long)local_25d0.ray + 0x44) = *(float *)(local_25d0.hit + 0x14);
                      *(float *)((long)local_25d0.ray + 0x48) = *(float *)(local_25d0.hit + 0x18);
                      *(float *)((long)local_25d0.ray + 0x4c) = *(float *)(local_25d0.hit + 0x1c);
                      *(float *)((long)local_25d0.ray + 0x50) = *(float *)(local_25d0.hit + 0x20);
                    }
                    else {
LAB_015a9ad5:
                      (ray->super_RayK<1>).tfar = fVar63;
                    }
                    *(undefined4 *)(local_25f0 + local_2630._0_8_ * 4) = 0;
                    fVar63 = (ray->super_RayK<1>).tfar;
                    auVar68._4_4_ = fVar63;
                    auVar68._0_4_ = fVar63;
                    auVar68._8_4_ = fVar63;
                    auVar68._12_4_ = fVar63;
                    auVar93 = vcmpps_avx(local_25a0,auVar68,2);
                    local_25f0 = vandps_avx(auVar93,local_25f0);
                    uVar52 = local_2620._0_8_;
                    pauVar58 = (undefined1 (*) [16])local_2610._0_8_;
                    auVar93 = local_25a0;
                  }
                  if ((((local_25f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_25f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_25f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_25f0[0xf]) break;
                  local_2620._0_8_ = uVar52;
                  local_2610._0_8_ = pauVar58;
                  local_25a0 = auVar93;
                  BVHNIntersector1<8,1,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect(&local_25d0);
                  piVar47 = local_25d0.valid;
                  pSVar48 = (Scene *)local_2590._0_8_;
                  uVar52 = local_2620._0_8_;
                  pauVar58 = (undefined1 (*) [16])local_2610._0_8_;
                  auVar93 = local_25a0;
                } while( true );
              }
            }
            lVar50 = lVar50 + 1;
          } while (lVar50 != uVar60 - 8);
        }
        fVar63 = (ray->super_RayK<1>).tfar;
        auVar69 = ZEXT3264(CONCAT428(fVar63,CONCAT424(fVar63,CONCAT420(fVar63,CONCAT416(fVar63,
                                                  CONCAT412(fVar63,CONCAT48(fVar63,CONCAT44(fVar63,
                                                  fVar63))))))));
        auVar98 = ZEXT3264(local_23c0);
        auVar101 = ZEXT3264(local_23e0);
        auVar103 = ZEXT3264(local_2400);
        auVar105 = ZEXT3264(local_2420);
        auVar109 = ZEXT3264(local_2440);
        auVar111 = ZEXT3264(local_2460);
        auVar119 = ZEXT3264(local_2480);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }